

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

size_t __thiscall
CVmObjByteArray::copy_from_buf_undo
          (CVmObjByteArray *this,vm_obj_id_t self,uchar *buf,unsigned_long idx,size_t len)

{
  unsigned_long uVar1;
  ulong uVar2;
  long in_RCX;
  size_t in_RDX;
  undefined4 in_ESI;
  uchar *in_RDI;
  ulong in_R8;
  CVmObjByteArray *unaff_retaddr;
  unsigned_long avail_len;
  undefined8 local_28;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar1 = get_element_count((CVmObjByteArray *)0x31ae6a);
  uVar2 = (uVar1 - in_RCX) + 1;
  local_28 = in_R8;
  if (uVar2 < in_R8) {
    local_28 = uVar2;
  }
  save_undo((CVmObjByteArray *)buf,idx._4_4_,len,avail_len);
  copy_from_buf(unaff_retaddr,in_RDI,CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  return local_28;
}

Assistant:

size_t CVmObjByteArray::copy_from_buf_undo(VMG_ vm_obj_id_t self,
                                           const unsigned char *buf,
                                           unsigned long idx, size_t len)
{
    /* limit the size to the remaining length from 'idx' */
    unsigned long avail_len = get_element_count() - idx + 1;
    if (len > avail_len)
        len = (size_t)avail_len;

    /* save undo */
    save_undo(vmg_ self, idx, len);

    /* copy the bytes */
    copy_from_buf(buf, idx, len);

    /* return the copy length */
    return len;
}